

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O3

int slang::ast::AssertionExpr::bind(int __fd,sockaddr *__addr,socklen_t __len)

{
  int iVar1;
  undefined4 extraout_var;
  AssertionExpr *expr;
  undefined4 in_register_0000003c;
  long lVar2;
  
  lVar2 = CONCAT44(in_register_0000003c,__fd);
  if (*(AssertionExpr **)(lVar2 + 0x20) != (AssertionExpr *)0x0) {
    iVar1 = bind(*(AssertionExpr **)(lVar2 + 0x20),(int)__addr,
                 (sockaddr *)(ulong)(*(long *)(lVar2 + 0x18) == 0),0);
    expr = (AssertionExpr *)CONCAT44(extraout_var,iVar1);
    if (*(DisableIffSyntax **)(lVar2 + 0x18) != (DisableIffSyntax *)0x0) {
      expr = DisableIffAssertionExpr::fromSyntax
                       (*(DisableIffSyntax **)(lVar2 + 0x18),expr,(ASTContext *)__addr);
      expr->syntax = *(SyntaxNode **)(lVar2 + 0x18);
    }
    if (*(TimingControlSyntax **)(lVar2 + 0x10) != (TimingControlSyntax *)0x0) {
      expr = ClockingAssertionExpr::fromSyntax
                       (*(TimingControlSyntax **)(lVar2 + 0x10),expr,(ASTContext *)__addr);
      expr->syntax = *(SyntaxNode **)(lVar2 + 0x10);
    }
    return (int)expr;
  }
  assert::assertFailed
            ("ptr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
             ,0x26,
             "T slang::not_null<slang::syntax::PropertyExprSyntax *>::get() const [T = slang::syntax::PropertyExprSyntax *]"
            );
}

Assistant:

const AssertionExpr& AssertionExpr::bind(const PropertySpecSyntax& syntax,
                                         const ASTContext& context) {
    ASTContext ctx(context);
    ctx.flags |= ASTFlags::AssignmentDisallowed;

    bool allowDisable = syntax.disable == nullptr;
    auto result = &bind(*syntax.expr, context, allowDisable);

    if (syntax.disable) {
        auto& disable = DisableIffAssertionExpr::fromSyntax(*syntax.disable, *result, context);
        disable.syntax = syntax.disable;
        result = &disable;
    }

    if (syntax.clocking) {
        auto& clocking = ClockingAssertionExpr::fromSyntax(*syntax.clocking, *result, context);
        clocking.syntax = syntax.clocking;
        result = &clocking;
    }

    return *result;
}